

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core>
helics::CoreFactory::create
          (CoreType type,string_view coreName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  string_view message;
  string_view name;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  RegistrationFailure *this;
  undefined8 uVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  char *in_RCX;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  char *in_R8;
  __sv_type _Var6;
  shared_ptr<helics::Core> sVar7;
  undefined1 in_stack_000000a0 [16];
  string_view in_stack_000000b0;
  CoreType newType;
  string newName;
  shared_ptr<helics::Core> *core;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined1 *puVar8;
  CoreType in_stack_fffffffffffffe7c;
  size_t in_stack_fffffffffffffe80;
  char *pcVar9;
  char *in_stack_fffffffffffffe88;
  undefined8 uVar10;
  undefined1 local_170 [44];
  CoreType type_00;
  shared_ptr<helics::Core> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  size_t local_110;
  char *local_108;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  local_80._M_len = in_RDX;
  local_80._M_str = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffffe50);
  if ((in_ESI == 0x65) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_80), bVar1)) {
    helics::core::extractCoreType
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    std::tie<helics::CoreType,std::__cxx11::string>
              ((CoreType *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               in_stack_fffffffffffffe40);
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffe50,
               (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
    std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x429640);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_80);
    if ((bVar1) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x429660), !bVar1)) {
      _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe40);
      local_110 = _Var6._M_len;
      local_80._M_len = local_110;
      local_108 = _Var6._M_str;
      local_80._M_str = local_108;
    }
  }
  name._M_str = in_stack_fffffffffffffe88;
  name._M_len = in_stack_fffffffffffffe80;
  makeCore(in_stack_fffffffffffffe7c,name);
  this = (RegistrationFailure *)
         std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x42971b);
  puVar8 = &stack0xfffffffffffffec0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  (*(*(_func_int ***)&this->super_HelicsException)[4])(this,puVar8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  uVar2 = registerCore(in_stack_fffffffffffffec0,type_00);
  if ((bool)uVar2) {
    std::__cxx11::string::~string(in_stack_fffffffffffffe40);
    sVar7.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar7.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<helics::Core>)
           sVar7.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  pcVar9 = "core {} failed to register properly";
  uVar10 = 0x23;
  peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x4297b0);
  iVar3 = (*peVar5->_vptr_Core[0xc])();
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(extraout_var,iVar3);
  local_18 = local_170;
  local_48 = pcVar9;
  uStack_40 = uVar10;
  local_30 = this_00;
  local_28 = pcVar9;
  uStack_20 = uVar10;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            ((value<fmt::v11::context> *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffe48));
  local_8 = &local_58;
  local_10 = local_68;
  local_58 = 0xd;
  local_50 = local_10;
  ::fmt::v11::vformat_abi_cxx11_(in_stack_000000b0,(format_args)in_stack_000000a0);
  join_0x00000010_0x00000000_ = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  message._M_str = in_R8;
  message._M_len = (size_t)puVar8;
  RegistrationFailure::RegistrationFailure(this,message);
  __cxa_throw(uVar4,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

std::shared_ptr<Core>
    create(CoreType type, std::string_view coreName, std::vector<std::string> args)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(args);
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }

    auto core = makeCore(type, coreName);
    core->configureFromVector(std::move(args));
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(
            fmt::format("core {} failed to register properly", core->getIdentifier())));
    }

    return core;
}